

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void sptk::world::InitializeInverseComplexFFT(int fft_size,InverseComplexFFT *inverse_complex_fft)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  int *in_RSI;
  int in_EDI;
  undefined1 auStackY_58 [16];
  uint in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  fft_complex *in_stack_ffffffffffffffc0;
  fft_complex *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  
  *in_RSI = in_EDI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDI;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *(void **)(in_RSI + 2) = pvVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_EDI;
  uVar3 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *(void **)(in_RSI + 4) = pvVar4;
  fft_plan_dft_1d(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                  in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  memcpy(in_RSI + 6,auStackY_58,0x48);
  return;
}

Assistant:

void InitializeInverseComplexFFT(int fft_size,
    InverseComplexFFT *inverse_complex_fft) {
  inverse_complex_fft->fft_size = fft_size;
  inverse_complex_fft->input = new fft_complex[fft_size];
  inverse_complex_fft->output = new fft_complex[fft_size];
  inverse_complex_fft->inverse_fft = fft_plan_dft_1d(fft_size,
    inverse_complex_fft->input, inverse_complex_fft->output,
    FFT_BACKWARD, FFT_ESTIMATE);
}